

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O0

int get_number(char *prompt)

{
  int local_70;
  int local_6c;
  int i;
  int n;
  char line [80];
  char *prompt_local;
  
  local_6c = 0;
  printf("%s",prompt);
  while (local_6c != 1) {
    local_6c = __isoc99_scanf("%d",&local_70);
    fgets((char *)&i,0x50,_stdin);
  }
  return local_70;
}

Assistant:

int get_number(char *prompt)
{
    char line[STRING_MAX];
    int n = 0, i;
    printf("%s", prompt);
    while (n != 1) {
        n = scanf("%d", &i);
        fgets(line, STRING_MAX, stdin);
    }
    return i;
}